

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prng_seed_finish(prng *pr)

{
  ssh_hash *psVar1;
  uint64_t uVar2;
  uchar buf [114];
  
  if ((ssh_hash *)pr[2].savesize == (ssh_hash *)0x0) {
    __assert_fail("pi->keymaker",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xb2,"void prng_seed_finish(prng *)");
  }
  ssh_hash_final((ssh_hash *)pr[2].savesize,buf);
  pr[2].savesize = 0;
  if (pr[1].binarysink_[0].write == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
    psVar1 = ssh_hash_new((ssh_hashalg *)pr[1].savesize);
    pr[1].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)psVar1;
    BinarySink_put_data(psVar1->binarysink_,buf,*(size_t *)(pr[1].savesize + 0x28));
    pr[0xc].binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40;
    uVar2 = prng_reseed_time_ms();
    pr[0xd].savesize = uVar2;
    smemclr(buf,0x72);
    return;
  }
  __assert_fail("!pi->generator",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                0xc0,"void prng_seed_finish(prng *)");
}

Assistant:

void prng_seed_finish(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);
    unsigned char buf[MAX_HASH_LEN];

    assert(pi->keymaker);

    prngdebug("prng: reseed finish\n");

    /*
     * Actually generate the key.
     */
    ssh_hash_final(pi->keymaker, buf);
    pi->keymaker = NULL;

    /*
     * Load that key into a fresh hash instance, which will become the
     * new generator.
     */
    assert(!pi->generator);
    pi->generator = ssh_hash_new(pi->hashalg);
    put_data(pi->generator, buf, pi->hashalg->hlen);

    pi->until_reseed = RESEED_DATA_SIZE;
    pi->last_reseed_time = prng_reseed_time_ms();

    smemclr(buf, sizeof(buf));
}